

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O3

void duckdb::HistogramBinFinalizeFunction<duckdb::HistogramStringFunctor,duckdb::string_t>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  ulong uVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar3;
  undefined8 uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  bool bVar6;
  LogicalType *type;
  Vector *pVVar7;
  TemplatedValidityData<unsigned_long> *pTVar8;
  _Head_base<0UL,_unsigned_long_*,_false> _Var9;
  long *plVar10;
  idx_t iVar11;
  long lVar12;
  long *plVar13;
  idx_t iVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  string_t sVar19;
  undefined1 auVar20 [16];
  UnifiedVectorFormat sdata;
  Value *local_120;
  unsigned_long local_c8;
  long *local_c0;
  long local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  undefined8 local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
  duckdb::Vector::ToUnifiedFormat((ulong)state_vector,(UnifiedVectorFormat *)count);
  FlatVector::VerifyFlatVector(result);
  local_120 = (Value *)duckdb::ListVector::GetListSize(result);
  type = (LogicalType *)duckdb::MapType::KeyType((LogicalType *)(result + 8));
  bVar6 = SupportsOtherBucket(type);
  if (count == 0) {
    lVar17 = 0;
  }
  else {
    lVar17 = 0;
    iVar11 = 0;
    do {
      iVar14 = iVar11;
      if (*local_c0 != 0) {
        iVar14 = (idx_t)*(uint *)(*local_c0 + iVar11 * 4);
      }
      plVar13 = *(long **)(local_b8 + iVar14 * 8);
      plVar10 = (long *)*plVar13;
      if (plVar10 != (long *)0x0) {
        lVar17 = (ulong)(*(long *)(*(long *)(plVar13[1] + 8) + -8) != 0 && bVar6) +
                 (plVar10[1] - *plVar10 >> 4) + lVar17;
      }
      iVar11 = iVar11 + 1;
    } while (count != iVar11);
  }
  duckdb::ListVector::Reserve(result,(ulong)(local_120 + lVar17));
  pVVar7 = (Vector *)duckdb::MapVector::GetKeys(result);
  lVar17 = duckdb::MapVector::GetValues(result);
  if (count != 0) {
    lVar2 = *(long *)(result + 0x20);
    lVar17 = *(long *)(lVar17 + 0x20);
    uVar15 = 0;
    do {
      uVar16 = uVar15;
      if (*local_c0 != 0) {
        uVar16 = (ulong)*(uint *)(*local_c0 + uVar15 * 4);
      }
      uVar1 = uVar15 + offset;
      plVar13 = *(long **)(local_b8 + uVar16 * 8);
      plVar10 = (long *)*plVar13;
      if (plVar10 == (long *)0x0) {
        _Var9._M_head_impl = *(unsigned_long **)(result + 0x28);
        if (_Var9._M_head_impl == (unsigned_long *)0x0) {
          local_c8 = *(unsigned_long *)(result + 0x40);
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_78,&local_c8);
          p_Var5 = p_Stack_70;
          uVar4 = local_78;
          local_78 = 0;
          p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
          *(undefined8 *)(result + 0x30) = uVar4;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var5;
          if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
             p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
          }
          pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                              (result + 0x30));
          _Var9._M_head_impl =
               (pTVar8->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          *(unsigned_long **)(result + 0x28) = _Var9._M_head_impl;
        }
        bVar3 = (byte)uVar1 & 0x3f;
        _Var9._M_head_impl[uVar1 >> 6] =
             _Var9._M_head_impl[uVar1 >> 6] & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
      }
      else {
        *(Value **)(lVar2 + uVar1 * 0x10) = local_120;
        lVar12 = *plVar10;
        if (plVar10[1] == lVar12) {
          plVar10 = (long *)plVar13[1];
        }
        else {
          lVar18 = 1;
          uVar16 = 0;
          do {
            sVar19.value.pointer.ptr = (char *)*(undefined8 *)(lVar12 + lVar18 * 8);
            sVar19.value._0_8_ = *(undefined8 *)(lVar12 + -8 + lVar18 * 8);
            auVar20 = duckdb::StringVector::AddStringOrBlob(pVVar7,sVar19);
            lVar12 = *(long *)(pVVar7 + 0x20) + (long)local_120 * 0x10;
            *(long *)(lVar12 + -8 + lVar18 * 8) = auVar20._0_8_;
            *(long *)(lVar12 + lVar18 * 8) = auVar20._8_8_;
            plVar10 = (long *)plVar13[1];
            *(undefined8 *)(lVar17 + (long)local_120 * 8 + uVar16 * 8) =
                 *(undefined8 *)(*plVar10 + uVar16 * 8);
            uVar16 = uVar16 + 1;
            lVar12 = *(long *)*plVar13;
            lVar18 = lVar18 + 2;
          } while (uVar16 < (ulong)(((long *)*plVar13)[1] - lVar12 >> 4));
          local_120 = local_120 + uVar16;
        }
        if (bVar6 && *(long *)(plVar10[1] + -8) != 0) {
          OtherBucketValue((duckdb *)&local_78,(LogicalType *)(pVVar7 + 8));
          duckdb::Vector::SetValue((ulong)pVVar7,local_120);
          duckdb::Value::~Value((Value *)&local_78);
          *(undefined8 *)(lVar17 + (long)local_120 * 8) =
               *(undefined8 *)(*(long *)(plVar13[1] + 8) + -8);
          local_120 = local_120 + 1;
        }
        plVar13 = (long *)(uVar1 * 0x10 + lVar2);
        plVar13[1] = (long)local_120 - *plVar13;
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != count);
  }
  duckdb::ListVector::SetListSize(result,(ulong)local_120);
  duckdb::Vector::Verify((ulong)result);
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  return;
}

Assistant:

static void HistogramBinFinalizeFunction(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count,
                                         idx_t offset) {
	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);
	auto states = UnifiedVectorFormat::GetData<HistogramBinState<T> *>(sdata);

	auto &mask = FlatVector::Validity(result);
	auto old_len = ListVector::GetListSize(result);
	idx_t new_entries = 0;
	bool supports_other_bucket = SupportsOtherBucket(MapType::KeyType(result.GetType()));
	// figure out how much space we need
	for (idx_t i = 0; i < count; i++) {
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.bin_boundaries) {
			continue;
		}
		new_entries += state.bin_boundaries->size();
		if (state.counts->back() > 0 && supports_other_bucket) {
			// overflow bucket has entries
			new_entries++;
		}
	}
	// reserve space in the list vector
	ListVector::Reserve(result, old_len + new_entries);
	auto &keys = MapVector::GetKeys(result);
	auto &values = MapVector::GetValues(result);
	auto list_entries = FlatVector::GetData<list_entry_t>(result);
	auto count_entries = FlatVector::GetData<uint64_t>(values);

	idx_t current_offset = old_len;
	for (idx_t i = 0; i < count; i++) {
		const auto rid = i + offset;
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.bin_boundaries) {
			mask.SetInvalid(rid);
			continue;
		}

		auto &list_entry = list_entries[rid];
		list_entry.offset = current_offset;
		for (idx_t bin_idx = 0; bin_idx < state.bin_boundaries->size(); bin_idx++) {
			OP::template HistogramFinalize<T>((*state.bin_boundaries)[bin_idx], keys, current_offset);
			count_entries[current_offset] = (*state.counts)[bin_idx];
			current_offset++;
		}
		if (state.counts->back() > 0 && supports_other_bucket) {
			// add overflow bucket ("others")
			// set bin boundary to NULL for overflow bucket
			keys.SetValue(current_offset, OtherBucketValue(keys.GetType()));
			count_entries[current_offset] = state.counts->back();
			current_offset++;
		}
		list_entry.length = current_offset - list_entry.offset;
	}
	D_ASSERT(current_offset == old_len + new_entries);
	ListVector::SetListSize(result, current_offset);
	result.Verify(count);
}